

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CartesianProduct.cpp
# Opt level: O1

shared_ptr<mnf::Manifold> __thiscall mnf::CartesianProduct::getNewCopy_(CartesianProduct *this)

{
  CartesianProduct *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  CartesianProduct *in_RSI;
  shared_ptr<mnf::Manifold> sVar1;
  shared_ptr<mnf::CartesianProduct> copy;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  this_00 = (CartesianProduct *)operator_new(0xa0);
  CartesianProduct(this_00,in_RSI);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mnf::CartesianProduct*>
            (&local_20,this_00);
  (this->super_Manifold)._vptr_Manifold = (_func_int **)this_00;
  (this->super_Manifold).super_RefCounter = 0;
  (this->super_Manifold).super_ValidManifold = 0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->super_Manifold).super_RefCounter =
       local_20._M_pi;
  sVar1.super___shared_ptr<mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &this->super_Manifold
  ;
  return (shared_ptr<mnf::Manifold>)
         sVar1.super___shared_ptr<mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Manifold> CartesianProduct::getNewCopy_() const
{
  std::shared_ptr<CartesianProduct> copy(new CartesianProduct(*this));
  return copy;
}